

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

int publickey_packet_receive(LIBSSH2_PUBLICKEY *pkey,uchar **data,size_t *data_len)

{
  LIBSSH2_CHANNEL *channel_00;
  int iVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  uchar *puVar4;
  size_t sVar5;
  ssize_t rc;
  LIBSSH2_SESSION *pLStack_38;
  uchar buffer [4];
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  size_t *data_len_local;
  uchar **data_local;
  LIBSSH2_PUBLICKEY *pkey_local;
  
  channel_00 = pkey->channel;
  pLStack_38 = channel_00->session;
  *data = (uchar *)0x0;
  *data_len = 0;
  if (pkey->receive_state == libssh2_NB_state_idle) {
    sVar3 = _libssh2_channel_read(channel_00,0,(char *)((long)&rc + 4),4);
    if (sVar3 == -0x25) {
      return -0x25;
    }
    if (sVar3 != 4) {
      iVar1 = _libssh2_error(pLStack_38,-0x24,"Invalid response from publickey subsystem");
      return iVar1;
    }
    uVar2 = _libssh2_ntohu32((uchar *)((long)&rc + 4));
    pkey->receive_packet_len = (ulong)uVar2;
    puVar4 = (uchar *)(*pLStack_38->alloc)(pkey->receive_packet_len,&pLStack_38->abstract);
    pkey->receive_packet = puVar4;
    if (pkey->receive_packet == (uchar *)0x0) {
      iVar1 = _libssh2_error(pLStack_38,-6,"Unable to allocate publickey response buffer");
      return iVar1;
    }
    pkey->receive_state = libssh2_NB_state_sent;
  }
  if (pkey->receive_state == libssh2_NB_state_sent) {
    sVar5 = _libssh2_channel_read
                      (channel_00,0,(char *)pkey->receive_packet,pkey->receive_packet_len);
    if (sVar5 == 0xffffffffffffffdb) {
      return -0x25;
    }
    if (sVar5 != pkey->receive_packet_len) {
      (*pLStack_38->free)(pkey->receive_packet,&pLStack_38->abstract);
      pkey->receive_packet = (uchar *)0x0;
      pkey->receive_state = libssh2_NB_state_idle;
      iVar1 = _libssh2_error(pLStack_38,-0x1e,
                             "Timeout waiting for publickey subsystem response packet");
      return iVar1;
    }
    *data = pkey->receive_packet;
    *data_len = pkey->receive_packet_len;
  }
  pkey->receive_state = libssh2_NB_state_idle;
  return 0;
}

Assistant:

static int
publickey_packet_receive(LIBSSH2_PUBLICKEY * pkey,
                         unsigned char **data, size_t *data_len)
{
    LIBSSH2_CHANNEL *channel = pkey->channel;
    LIBSSH2_SESSION *session = channel->session;
    unsigned char buffer[4];
    ssize_t rc;
    *data = NULL; /* default to nothing returned */
    *data_len = 0;

    if(pkey->receive_state == libssh2_NB_state_idle) {
        rc = _libssh2_channel_read(channel, 0, (char *) buffer, 4);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if(rc != 4) {
            return _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                  "Invalid response from publickey subsystem");
        }

        pkey->receive_packet_len = _libssh2_ntohu32(buffer);
        pkey->receive_packet =
            LIBSSH2_ALLOC(session, pkey->receive_packet_len);
        if(!pkey->receive_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate publickey response "
                                  "buffer");
        }

        pkey->receive_state = libssh2_NB_state_sent;
    }

    if(pkey->receive_state == libssh2_NB_state_sent) {
        rc = _libssh2_channel_read(channel, 0, (char *) pkey->receive_packet,
                                   pkey->receive_packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if(rc != (ssize_t)pkey->receive_packet_len) {
            LIBSSH2_FREE(session, pkey->receive_packet);
            pkey->receive_packet = NULL;
            pkey->receive_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                                  "Timeout waiting for publickey subsystem "
                                  "response packet");
        }

        *data = pkey->receive_packet;
        *data_len = pkey->receive_packet_len;
    }

    pkey->receive_state = libssh2_NB_state_idle;

    return 0;
}